

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

Error miniros::changeCurrentDirectory(string *path)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  path *in_stack_ffffffffffffff70;
  path *this;
  path local_70;
  format in_stack_ffffffffffffffc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  path *in_stack_ffffffffffffffd0;
  Error local_4;
  
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
  bVar1 = std::filesystem::exists(in_stack_ffffffffffffff70);
  std::filesystem::__cxx11::path::~path(in_stack_ffffffffffffff70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this = &local_70;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
    std::filesystem::current_path(this);
    std::filesystem::__cxx11::path::~path(this);
    Error::Error(&local_4,Ok);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to change current directory \"");
    poVar2 = std::operator<<(poVar2,in_RDI);
    poVar2 = std::operator<<(poVar2,"\" - path do not exists");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    Error::Error(&local_4,SystemError);
  }
  return (Error)local_4.code;
}

Assistant:

Error changeCurrentDirectory(const std::string& path)
{
  if (!std::filesystem::exists(path)) {
    std::cerr << "Failed to change current directory \"" << path << "\" - path do not exists" << std::endl;
    return Error::SystemError;
  }
  std::filesystem::current_path(path);
  return Error::Ok;
}